

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQObjectPtr *pSVar5;
  SQTable *pSVar6;
  SQTable *pSVar7;
  
  if (idx < 0) {
    pSVar4 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar4 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  SVar3 = (pSVar4->super_SQObject)._type;
  if (SVar3 == OT_NATIVECLOSURE) {
    if (nval < ((pSVar4->super_SQObject)._unVal.pClosure)->_defaultparams) {
      pSVar5 = SQVM::GetUp(v,-1);
      pSVar4 = ((pSVar4->super_SQObject)._unVal.pClosure)->_outervalues;
      SVar2 = pSVar4[nval].super_SQObject._type;
      pSVar7 = pSVar4[nval].super_SQObject._unVal.pTable;
      pSVar6 = (pSVar5->super_SQObject)._unVal.pTable;
      pSVar4[nval].super_SQObject._unVal.pTable = pSVar6;
      SVar3 = (pSVar5->super_SQObject)._type;
      pSVar4[nval].super_SQObject._type = SVar3;
      goto LAB_00113d45;
    }
  }
  else {
    if (SVar3 != OT_CLOSURE) {
      sq_aux_invalidtype(v,SVar3);
      return -1;
    }
    if (nval < (ulong)((pSVar4->super_SQObject)._unVal.pClosure)->_function->_noutervalues) {
      pSVar5 = SQVM::GetUp(v,-1);
      pSVar4 = ((((pSVar4->super_SQObject)._unVal.pClosure)->_outervalues[nval].super_SQObject.
                 _unVal.pArray)->_values)._vals;
      SVar2 = (pSVar4->super_SQObject)._type;
      pSVar7 = (pSVar4->super_SQObject)._unVal.pTable;
      pSVar6 = (pSVar5->super_SQObject)._unVal.pTable;
      (pSVar4->super_SQObject)._unVal.pTable = pSVar6;
      SVar3 = (pSVar5->super_SQObject)._type;
      (pSVar4->super_SQObject)._type = SVar3;
LAB_00113d45:
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar7->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      SQVM::Pop(v);
      return 0;
    }
  }
  sq_throwerror(v,"invalid free var index");
  return -1;
}

Assistant:

SQRESULT sq_setfreevariable(HSQUIRRELVM v,SQInteger idx,SQUnsignedInteger nval)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(type(self))
    {
    case OT_CLOSURE:{
        SQFunctionProto *fp = _closure(self)->_function;
        if(((SQUnsignedInteger)fp->_noutervalues) > nval){
            *(_outer(_closure(self)->_outervalues[nval])->_valptr) = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
                    }
        break;
    case OT_NATIVECLOSURE:
        if(_nativeclosure(self)->_noutervalues > nval){
            _nativeclosure(self)->_outervalues[nval] = stack_get(v,-1);
        }
        else return sq_throwerror(v,_SC("invalid free var index"));
        break;
    default:
        return sq_aux_invalidtype(v,type(self));
    }
    v->Pop();
    return SQ_OK;
}